

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

int __thiscall QString::localeAwareCompare(QString *this,QString *other)

{
  int iVar1;
  char16_t *data1;
  char16_t *data2;
  
  data1 = (this->d).ptr;
  if ((QChar *)data1 == (QChar *)0x0) {
    data1 = &_empty;
  }
  data2 = (other->d).ptr;
  if ((QChar *)data2 == (QChar *)0x0) {
    data2 = &_empty;
  }
  iVar1 = localeAwareCompare_helper((QChar *)data1,(this->d).size,(QChar *)data2,(other->d).size);
  return iVar1;
}

Assistant:

const T *data() const noexcept { return ptr; }